

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O0

void __thiscall
PatchImproveGoldRewardsHandling::inject_data
          (PatchImproveGoldRewardsHandling *this,ROM *rom,World *world)

{
  uint16_t uVar1;
  uint32_t uVar2;
  allocator<char> local_81;
  string local_80;
  out_of_range *anon_var_0;
  Item *local_48;
  Item *gold_item;
  size_t id;
  ByteArray byte_array;
  World *world_local;
  ROM *rom_local;
  PatchImproveGoldRewardsHandling *this_local;
  
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)world;
  ByteArray::ByteArray((ByteArray *)&id);
  for (gold_item = (Item *)0x40; gold_item < (Item *)0x70;
      gold_item = (Item *)((long)&gold_item->_vptr_Item + 1)) {
    local_48 = World::item((World *)byte_array.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (uint8_t)gold_item);
    uVar1 = Item::gold_value(local_48);
    ByteArray::add_byte((ByteArray *)&id,(uint8_t)uVar1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  uVar2 = md::ROM::inject_bytes
                    (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&id,&local_80);
  this->_gold_rewards_table_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  ByteArray::~ByteArray((ByteArray *)&id);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        ByteArray byte_array;
        for(size_t id=ITEM_GOLDS_START ; id < ITEM_GOLDS_END ; ++id)
        {
            try {
                Item* gold_item = world.item(id);
                byte_array.add_byte(static_cast<uint8_t>(gold_item->gold_value()));
            } catch(std::out_of_range&) {
                break;
            }
        }

        _gold_rewards_table_addr = rom.inject_bytes(byte_array);
    }